

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

void __thiscall argagg::fmt_ostream::~fmt_ostream(fmt_ostream *this,void **vtt)

{
  _func_int **pp_Var1;
  ostream *poVar2;
  string sStack_58;
  string local_38;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = pp_Var1;
  *(void **)((long)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[5];
  poVar2 = *(ostream **)
            &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0x70;
  std::__cxx11::stringbuf::str();
  fmt_string(&local_38,&sStack_58);
  std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

inline
fmt_ostream::~fmt_ostream()
{
  output << fmt_string(this->str());
}